

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

pair<example::spread_t,_boost::asio::const_buffer> *
read<example::spread_t>
          (pair<example::spread_t,_boost::asio::const_buffer> *__return_storage_ptr__,const_buffer b
          )

{
  undefined8 uVar1;
  reader r;
  spread_t local_78;
  reader local_30;
  
  local_30.buf_.size_ = b.size_;
  local_30.buf_.data_ = b.data_;
  local_30.opts_.super_type.m_initialized = false;
  local_78.legs.val_.super_type.m_storage.dummy_.aligner_ = (type)0x0;
  local_78.legs.val_.super_type.m_storage.dummy_._8_8_ = (type)0x0;
  local_78.legs.val_.super_type.m_storage.dummy_._16_8_ = 0;
  local_78.contract_id.ptr_ = (char *)0x0;
  local_78.contract_id.len_ = 0;
  local_78.legs.buf_.data_ = (void *)0x0;
  local_78.legs.buf_.size_ = 0;
  local_78.legs.val_.super_type.m_initialized = true;
  detail::reader::operator()(&local_30,&local_78);
  (__return_storage_ptr__->first).contract_id.ptr_ = local_78.contract_id.ptr_;
  (__return_storage_ptr__->first).contract_id.len_ = local_78.contract_id.len_;
  (__return_storage_ptr__->first).legs.buf_.data_ = local_78.legs.buf_.data_;
  (__return_storage_ptr__->first).legs.buf_.size_ = local_78.legs.buf_.size_;
  (__return_storage_ptr__->first).legs.val_.super_type.m_initialized = false;
  if (local_78.legs.val_.super_type.m_initialized == true) {
    std::vector<example::option_t,_std::allocator<example::option_t>_>::vector
              ((vector<example::option_t,_std::allocator<example::option_t>_> *)
               &(__return_storage_ptr__->first).legs.val_.super_type.m_storage,
               (vector<example::option_t,_std::allocator<example::option_t>_> *)
               &local_78.legs.val_.super_type.m_storage);
    (__return_storage_ptr__->first).legs.val_.super_type.m_initialized = true;
  }
  (__return_storage_ptr__->second).data_ = local_30.buf_.data_;
  (__return_storage_ptr__->second).size_ = local_30.buf_.size_;
  uVar1 = local_78.legs.val_.super_type.m_storage.dummy_.aligner_;
  if ((local_78.legs.val_.super_type.m_initialized & 1U) != 0) {
    for (; uVar1 != local_78.legs.val_.super_type.m_storage.dummy_._8_8_; uVar1 = uVar1 + 0x38) {
      if (*(char *)(uVar1 + 0x2c) == '\x01') {
        *(undefined1 *)(uVar1 + 0x2c) = 0;
      }
    }
    if (local_78.legs.val_.super_type.m_storage.dummy_.aligner_ != (type)0x0) {
      operator_delete((void *)local_78.legs.val_.super_type.m_storage.dummy_.aligner_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<T, asio::const_buffer> read(asio::const_buffer b) {
    detail::reader r(std::move(b));
    T res;
    r(res);
    return std::make_pair(res, r.buf_);
}